

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O1

idx_t duckdb::SortKeyConstantOperator<float>::Decode
                (const_data_ptr_t input,Vector *result,idx_t result_idx,bool flip_bytes)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined7 in_register_00000009;
  
  if ((int)CONCAT71(in_register_00000009,flip_bytes) == 0) {
    uVar2 = *(uint *)input;
  }
  else {
    uVar2 = ~*(uint *)input;
  }
  uVar1 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8;
  uVar3 = uVar1 | uVar2 << 0x18;
  if (uVar3 + 2 < 3) {
    uVar2 = *(uint *)(&DAT_01e3a1e0 + (ulong)(uVar3 + 2) * 4);
  }
  else {
    uVar2 = uVar1 | uVar2 << 0x18 & 0x7fffffff;
    if (-1 < (int)uVar3) {
      uVar2 = ~uVar3;
    }
  }
  *(uint *)(result->data + result_idx * 4) = uVar2;
  return 4;
}

Assistant:

static inline data_ptr_t GetData(Vector &vector) {
		D_ASSERT(vector.GetVectorType() == VectorType::CONSTANT_VECTOR ||
		         vector.GetVectorType() == VectorType::FLAT_VECTOR);
		return vector.data;
	}